

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerPosixPipeConnection.cxx
# Opt level: O2

void __thiscall
cmDebugger::cmDebuggerPipeClient_POSIX::WaitForConnection(cmDebuggerPipeClient_POSIX *this)

{
  int iVar1;
  runtime_error *prVar2;
  int *piVar3;
  char *pcVar4;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  sockaddr_un addr;
  
  iVar1 = socket(1,1,0);
  this->rw_pipe = iVar1;
  if (iVar1 < 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Failed to create socket: ",(allocator<char> *)&local_a8);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,
                   &local_c8,pcVar4);
    std::runtime_error::runtime_error(prVar2,(string *)&addr);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  addr.sun_family = 1;
  strncpy(addr.sun_path,(this->PipeName)._M_dataplus._M_p,0x6c);
  addr.sun_path[0x6b] = '\0';
  iVar1 = connect(iVar1,(sockaddr *)&addr,0x6e);
  if (iVar1 != -1) {
    return;
  }
  (**(code **)((long)(this->super_ReaderWriter).super_Reader + 0x18))(this);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Failed to connect path to socket: ",&local_c9);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::operator+(&local_c8,&local_a8,pcVar4);
  std::runtime_error::runtime_error(prVar2,(string *)&local_c8);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void cmDebuggerPipeClient_POSIX::WaitForConnection()
{
  rw_pipe = socket(AF_UNIX, SOCK_STREAM, 0);
  if (rw_pipe < 0) {
    throw std::runtime_error(std::string("Failed to create socket: ") +
                             strerror(errno));
  }

  sockaddr_un addr;
  addr.sun_family = AF_UNIX;
  strncpy(addr.sun_path, PipeName.c_str(), sizeof(addr.sun_path));
  addr.sun_path[sizeof(addr.sun_path) - 1] = '\0';
  if (connect(rw_pipe, (sockaddr*)&addr, sizeof(addr)) == -1) {
    close();
    throw std::runtime_error(
      std::string("Failed to connect path to socket: ") + strerror(errno));
  }
}